

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_error(ERROR_HANDLE error)

{
  ERROR_INSTANCE *error_instance;
  AMQP_VALUE result;
  ERROR_HANDLE error_local;
  
  if (error == (ERROR_HANDLE)0x0) {
    error_instance = (ERROR_INSTANCE *)0x0;
  }
  else {
    error_instance = (ERROR_INSTANCE *)amqpvalue_clone(error->composite_value);
  }
  return (AMQP_VALUE)error_instance;
}

Assistant:

AMQP_VALUE amqpvalue_create_error(ERROR_HANDLE error)
{
    AMQP_VALUE result;

    if (error == NULL)
    {
        result = NULL;
    }
    else
    {
        ERROR_INSTANCE* error_instance = (ERROR_INSTANCE*)error;
        result = amqpvalue_clone(error_instance->composite_value);
    }

    return result;
}